

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
spirv_cross::Compiler::check_internal_recursion
          (Compiler *this,SPIRType *type,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *checked_ids)

{
  bool bVar1;
  size_type sVar2;
  SPIRType *type_00;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  __node_gen_type __node_gen;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_40;
  uint32_t local_34;
  
  if (type->basetype == Struct) {
    local_40 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)CONCAT44(local_40._4_4_,(type->super_IVariant).self.id);
    sVar2 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&checked_ids->_M_h,(key_type_conflict *)&local_40);
    bVar1 = true;
    if (sVar2 == 0) {
      local_34 = (type->super_IVariant).self.id;
      local_40 = checked_ids;
      ::std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)checked_ids);
      uVar3 = (ulong)(uint)(type->member_types).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                           buffer_size;
      if (uVar3 == 0) {
        bVar1 = false;
      }
      else {
        uVar4 = 1;
        do {
          type_00 = Variant::get<spirv_cross::SPIRType>
                              ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                               (type->member_types).
                               super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                               [uVar4 - 1].id);
          bVar1 = check_internal_recursion(this,type_00,checked_ids);
          if (bVar1) break;
          bVar5 = uVar4 < uVar3;
          uVar4 = uVar4 + 1;
        } while (bVar5);
      }
      local_40 = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)CONCAT44(local_40._4_4_,(type->super_IVariant).self.id);
      ::std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase(&checked_ids->_M_h);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Compiler::check_internal_recursion(const SPIRType &type, std::unordered_set<uint32_t> &checked_ids)
{
	if (type.basetype != SPIRType::Struct)
		return false;

	if (checked_ids.count(type.self))
		return true;

	// Recurse into struct members
	bool is_recursive = false;
	checked_ids.insert(type.self);
	uint32_t mbr_cnt = uint32_t(type.member_types.size());
	for (uint32_t mbr_idx = 0; !is_recursive && mbr_idx < mbr_cnt; mbr_idx++)
	{
		uint32_t mbr_type_id = type.member_types[mbr_idx];
		auto &mbr_type = get<SPIRType>(mbr_type_id);
		is_recursive |= check_internal_recursion(mbr_type, checked_ids);
	}
	checked_ids.erase(type.self);
	return is_recursive;
}